

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O3

void nn_cinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_ctx **self_00;
  int iVar1;
  nn_list_item *it;
  nn_list_item *pnVar2;
  nn_sinproc *self_01;
  
  if (type == -3 && src == -2) {
    nn_ins_disconnect((nn_ins_item *)&self[1].shutdown_fn);
    self_00 = &self[1].ctx;
    it = nn_list_begin((nn_list *)self_00);
    while( true ) {
      pnVar2 = nn_list_end((nn_list *)self_00);
      if (it == pnVar2) break;
      self_01 = (nn_sinproc *)(it + -0x28);
      if (it == (nn_list_item *)0x0) {
        self_01 = (nn_sinproc *)0x0;
      }
      nn_sinproc_stop(self_01);
      it = nn_list_next((nn_list *)self_00,it);
    }
    *(undefined4 *)&self[1].fn = 3;
  }
  else {
    if (*(int *)&self[1].fn != 3) {
      nn_cinproc_shutdown_cold_1();
    }
    nn_list_erase((nn_list *)&self[1].ctx,(nn_list_item *)((long)srcptr + 0x280));
    nn_sinproc_term((nn_sinproc *)srcptr);
    nn_free(srcptr);
  }
  iVar1 = nn_list_empty((nn_list *)&self[1].ctx);
  if (iVar1 != 0) {
    *(undefined4 *)&self[1].fn = 1;
    nn_fsm_stopped_noevent(self);
    nn_ep_stopped((nn_ep *)self[1].srcptr);
    return;
  }
  return;
}

Assistant:

static void nn_cinproc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cinproc *cinproc;
    struct nn_sinproc *sinproc;
    struct nn_list_item *it;

    cinproc = nn_cont (self, struct nn_cinproc, fsm);

    if (src == NN_FSM_ACTION && type == NN_FSM_STOP) {

        /*  First, unregister the endpoint from the global repository of inproc
            endpoints. This way, new connections cannot be created anymore. */
        nn_ins_disconnect (&cinproc->item);

        /*  Stop the existing connection. */
        for (it = nn_list_begin (&cinproc->sinprocs);
              it != nn_list_end (&cinproc->sinprocs);
              it = nn_list_next (&cinproc->sinprocs, it)) {
            sinproc = nn_cont (it, struct nn_sinproc, item);
            nn_sinproc_stop (sinproc);
        }
        cinproc->state = NN_CINPROC_STATE_STOPPING;
        goto finish;
    }
    if (cinproc->state == NN_CINPROC_STATE_STOPPING) {
        sinproc = (struct nn_sinproc *) srcptr;
        nn_list_erase (&cinproc->sinprocs, &sinproc->item);
        nn_sinproc_term (sinproc);
        nn_free (sinproc);

finish:
        if (!nn_list_empty (&cinproc->sinprocs))
            return;
        cinproc->state = NN_CINPROC_STATE_IDLE;
        nn_fsm_stopped_noevent (&cinproc->fsm);
        nn_ep_stopped (cinproc->item.ep);
        return;
    }

    nn_fsm_bad_state(cinproc->state, src, type);
}